

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O3

ans_smsb_encode<10U> *
ans_smsb_encode<10U>::create(ans_smsb_encode<10U> *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  uint *puVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  pointer puVar10;
  pointer __s;
  size_t sVar11;
  uint64_t uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint64_t *puVar16;
  long lVar17;
  uint32_t uVar18;
  uint largest_sym;
  ushort uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  undefined1 local_48 [16];
  pointer local_38;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __s = (pointer)operator_new(0x2800);
  largest_sym = 0;
  local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x500;
  memset(__s,0,0x2800);
  if (n != 0) {
    sVar11 = 0;
    largest_sym = 0;
    do {
      uVar13 = in_u32[sVar11];
      if (0x100 < uVar13) {
        if (uVar13 < 0x10001) {
          uVar13 = (uVar13 >> 8) + 0x100;
        }
        else if (uVar13 < 0x1000001) {
          uVar13 = uVar13 >> 0x10 | 0x200;
        }
        else {
          uVar13 = uVar13 >> 0x18 | 0x300;
        }
      }
      __s[uVar13] = __s[uVar13] + 1;
      if (largest_sym < uVar13) {
        largest_sym = uVar13;
      }
      sVar11 = sVar11 + 1;
    } while (n != sVar11);
  }
  local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x500;
  adjust_freqs((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,&local_60,largest_sym
               ,true,10);
  puVar10 = local_38;
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_38 = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar10;
  local_48 = (undefined1  [16])0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
    }
  }
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    uVar12 = 0;
  }
  else {
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    uVar15 = 0;
    auVar23 = vpbroadcastq_avx512f();
    auVar23 = vpsrlq_avx512f(auVar23,2);
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar26);
      auVar26 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar7 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar26,auVar23,2);
      bVar9 = (byte)uVar7;
      uVar19 = CONCAT11(bVar9,bVar8);
      auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar15));
      auVar24._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar26._4_4_;
      auVar24._0_4_ = (uint)(bVar8 & 1) * auVar26._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar26._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar26._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar26._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar26._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar26._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar26._28_4_;
      auVar24._32_4_ = (uint)(bVar9 & 1) * auVar26._32_4_;
      auVar24._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar26._36_4_;
      auVar24._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar26._40_4_;
      auVar24._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar26._44_4_;
      auVar24._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar26._48_4_;
      auVar24._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar26._52_4_;
      auVar24._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar26._56_4_;
      auVar24._60_4_ = (uint)(bVar9 >> 7) * auVar26._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar26 = vpaddd_avx512f(auVar24,auVar25);
    } while ((((ulong)((long)puVar3 + (-4 - (long)puVar2)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar15);
    auVar21 = vmovdqa32_avx512f(auVar26);
    auVar22._0_4_ = (uint)(bVar8 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar25._0_4_;
    bVar4 = (bool)((byte)(uVar19 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar4 * auVar21._4_4_ | (uint)!bVar4 * auVar25._4_4_;
    bVar4 = (bool)((byte)(uVar19 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar4 * auVar21._8_4_ | (uint)!bVar4 * auVar25._8_4_;
    bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar4 * auVar21._12_4_ | (uint)!bVar4 * auVar25._12_4_;
    bVar4 = (bool)((byte)(uVar19 >> 4) & 1);
    auVar22._16_4_ = (uint)bVar4 * auVar21._16_4_ | (uint)!bVar4 * auVar25._16_4_;
    bVar4 = (bool)((byte)(uVar19 >> 5) & 1);
    auVar22._20_4_ = (uint)bVar4 * auVar21._20_4_ | (uint)!bVar4 * auVar25._20_4_;
    bVar4 = (bool)((byte)(uVar19 >> 6) & 1);
    auVar22._24_4_ = (uint)bVar4 * auVar21._24_4_ | (uint)!bVar4 * auVar25._24_4_;
    bVar4 = (bool)((byte)(uVar19 >> 7) & 1);
    auVar22._28_4_ = (uint)bVar4 * auVar21._28_4_ | (uint)!bVar4 * auVar25._28_4_;
    auVar22._32_4_ = (uint)(bVar9 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar25._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar22._36_4_ = (uint)bVar4 * auVar21._36_4_ | (uint)!bVar4 * auVar25._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar22._40_4_ = (uint)bVar4 * auVar21._40_4_ | (uint)!bVar4 * auVar25._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar22._44_4_ = (uint)bVar4 * auVar21._44_4_ | (uint)!bVar4 * auVar25._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar22._48_4_ = (uint)bVar4 * auVar21._48_4_ | (uint)!bVar4 * auVar25._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar22._52_4_ = (uint)bVar4 * auVar21._52_4_ | (uint)!bVar4 * auVar25._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar22._56_4_ = (uint)bVar4 * auVar21._56_4_ | (uint)!bVar4 * auVar25._56_4_;
    auVar22._60_4_ =
         (uint)(bVar9 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar25._60_4_;
    auVar20 = vextracti64x4_avx512f(auVar22,1);
    auVar21 = vpaddd_avx512f(auVar22,ZEXT3264(auVar20));
    auVar5 = vpaddd_avx(auVar21._0_16_,auVar21._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    uVar12 = (uint64_t)auVar5._0_4_;
  }
  __return_storage_ptr__->frame_size = uVar12;
  std::vector<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>::resize
            (&__return_storage_ptr__->table,(ulong)(largest_sym + 1));
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar14 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar14 != 0) {
    lVar14 = lVar14 >> 2;
    lVar17 = 0;
    uVar18 = 0;
    puVar16 = &((__return_storage_ptr__->table).
                super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl.
                super__Vector_impl_data._M_start)->sym_upper_bound;
    do {
      ((enc_entry_smsb *)(puVar16 + -1))->freq = puVar2[lVar17];
      *(uint32_t *)((long)puVar16 + -4) = uVar18;
      puVar1 = puVar2 + lVar17;
      lVar17 = lVar17 + 1;
      uVar18 = uVar18 + *puVar1;
      *puVar16 = (ulong)*puVar1 << 0x24;
      puVar16 = puVar16 + 2;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar17);
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static ans_smsb_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_smsb_encode model;
        std::vector<uint64_t> freqs(smsb_constants::MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32 = ans_smsb_mapping(in_u32[i]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true, H_approx);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }